

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O0

void __thiscall time2::operator()(time2 *this,error_code *e)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  error_code *in_RSI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  iVar1 = std::error_code::value(in_RSI);
  if (iVar1 == 1) {
    occured2_at._0_12_ = booster::ptime::now();
    booster::aio::io_service::stop();
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22);
  std::operator<<(poVar2," e.value()==booster::aio::aio_error::canceled");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(e.value()==booster::aio::aio_error::canceled);
		occured2_at = booster::ptime::now();
		srv->stop();

	}